

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_ptr_field.h
# Opt level: O0

void * __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::AddInternal<void*(*)(google::protobuf::Arena*)>
          (RepeatedPtrFieldBase *this,_func_void_ptr_Arena_ptr *factory)

{
  bool bVar1;
  int iVar2;
  Arena *pAVar3;
  void *pvVar4;
  void **ppvVar5;
  Rep *pRVar6;
  void **result;
  Rep *r;
  Rep *r_1;
  void **result_1;
  Arena *arena;
  _func_void_ptr_Arena_ptr *factory_local;
  RepeatedPtrFieldBase *this_local;
  
  pAVar3 = GetArena(this);
  if (this->tagged_rep_or_elem_ == (void *)0x0) {
    ExchangeCurrentSize(this,1);
    pvVar4 = (*factory)(pAVar3);
    this->tagged_rep_or_elem_ = pvVar4;
    this_local = (RepeatedPtrFieldBase *)this->tagged_rep_or_elem_;
  }
  else {
    bVar1 = using_sso(this);
    if (bVar1) {
      if (this->current_size_ == 0) {
        ExchangeCurrentSize(this,1);
        this_local = (RepeatedPtrFieldBase *)this->tagged_rep_or_elem_;
      }
      else {
        ppvVar5 = InternalExtend(this,1);
        pvVar4 = (*factory)(pAVar3);
        *ppvVar5 = pvVar4;
        pRVar6 = rep(this);
        pRVar6->allocated_size = 2;
        ExchangeCurrentSize(this,2);
        this_local = (RepeatedPtrFieldBase *)*ppvVar5;
      }
    }
    else {
      result = (void **)rep(this);
      bVar1 = SizeAtCapacity(this);
      if (bVar1) {
        InternalExtend(this,1);
        result = (void **)rep(this);
      }
      else if (this->current_size_ != ((Rep *)result)->allocated_size) {
        iVar2 = ExchangeCurrentSize(this,this->current_size_ + 1);
        return ((Rep *)result)->elements[iVar2];
      }
      *(int *)result = *(int *)result + 1;
      iVar2 = ExchangeCurrentSize(this,this->current_size_ + 1);
      pvVar4 = (*factory)(pAVar3);
      result[(long)iVar2 + 1] = pvVar4;
      this_local = (RepeatedPtrFieldBase *)result[(long)iVar2 + 1];
    }
  }
  return this_local;
}

Assistant:

void* RepeatedPtrFieldBase::AddInternal(Factory factory) {
  Arena* const arena = GetArena();
  if (tagged_rep_or_elem_ == nullptr) {
    ExchangeCurrentSize(1);
    tagged_rep_or_elem_ = factory(arena);
    return tagged_rep_or_elem_;
  }
  absl::PrefetchToLocalCache(tagged_rep_or_elem_);
  if (using_sso()) {
    if (current_size_ == 0) {
      ExchangeCurrentSize(1);
      return tagged_rep_or_elem_;
    }
    void*& result = *InternalExtend(1);
    result = factory(arena);
    Rep* r = rep();
    r->allocated_size = 2;
    ExchangeCurrentSize(2);
    return result;
  }
  Rep* r = rep();
  if (PROTOBUF_PREDICT_FALSE(SizeAtCapacity())) {
    InternalExtend(1);
    r = rep();
  } else {
    if (current_size_ != r->allocated_size) {
      return r->elements[ExchangeCurrentSize(current_size_ + 1)];
    }
  }
  ++r->allocated_size;
  void*& result = r->elements[ExchangeCurrentSize(current_size_ + 1)];
  result = factory(arena);
  return result;
}